

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

parasail_sequences_t * parasail_sequences_from_file(char *filename)

{
  kstream_t *ks;
  size_t sVar1;
  kstring_t *str;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  parasail_sequences_t *ppVar5;
  parasail_sequence_t *__ptr;
  int *piVar6;
  kstring_t *str_00;
  undefined8 *puVar7;
  void *pvVar8;
  ssize_t sVar9;
  char *pcVar10;
  parasail_sequence_t *ppVar11;
  ulong uVar12;
  size_t sVar13;
  size_t __size;
  bool bVar14;
  double dVar15;
  double dVar16;
  undefined8 uVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined4 uVar21;
  undefined4 uVar22;
  uint local_e0;
  int local_dc;
  double local_d8;
  undefined8 uStack_d0;
  ulong local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  double local_a8;
  double dStack_a0;
  ulong local_90;
  double local_88;
  double local_80;
  int local_74;
  size_t local_70;
  double local_68;
  undefined8 uStack_60;
  FILE *local_50;
  parasail_sequences_t *local_48;
  kstring_t *local_40;
  kstring_t *local_38;
  
  ppVar5 = (parasail_sequences_t *)malloc(0x30);
  if (ppVar5 == (parasail_sequences_t *)0x0) {
    parasail_sequences_from_file_cold_4();
  }
  else {
    __ptr = (parasail_sequence_t *)malloc(64000);
    if (__ptr == (parasail_sequence_t *)0x0) {
      parasail_sequences_from_file_cold_3();
    }
    else {
      local_74 = strncmp("stdin",filename,5);
      local_50 = _stdin;
      if (local_74 != 0) {
        piVar6 = __errno_location();
        *piVar6 = 0;
        local_50 = fopen(filename,"r");
        if (local_50 == (FILE *)0x0) {
          parasail_sequences_from_file_cold_1();
          return (parasail_sequences_t *)0x0;
        }
      }
      local_48 = ppVar5;
      iVar3 = fileno(local_50);
      str_00 = (kstring_t *)calloc(1,0x70);
      puVar7 = (undefined8 *)calloc(1,0x18);
      *(int *)((long)puVar7 + 0x14) = iVar3;
      pvVar8 = malloc(0x4000);
      *puVar7 = pvVar8;
      str_00[4].m = (size_t)puVar7;
      local_38 = str_00 + 3;
      local_40 = str_00 + 1;
      local_90 = 1000;
      local_68 = 0.0;
      uStack_60 = 0;
      uVar12 = 0;
      local_d8 = 0.0;
      uStack_d0 = 0;
      local_70 = 0;
      local_dc = 0;
      uVar21 = 0;
      uVar22 = 0;
      dVar15 = 0.0;
      do {
        local_80 = (double)CONCAT44(uVar22,uVar21);
        local_c0 = uVar12;
        local_88 = dVar15;
        do {
          ks = (kstream_t *)str_00[4].m;
          dVar15 = local_d8;
          uVar19 = uStack_d0;
          if ((int)str_00[4].l == 0) {
            do {
              iVar3 = ks->end;
              sVar13 = 0xfffffffd;
              if ((iVar3 != -1) && ((ks->is_eof == 0 || (sVar13 = 0xffffffff, ks->begin < iVar3))))
              {
                if (ks->begin < iVar3) {
LAB_004b425c:
                  iVar3 = ks->begin;
                  ks->begin = iVar3 + 1;
                  sVar13 = (size_t)ks->buf[iVar3];
                }
                else {
                  ks->begin = 0;
                  sVar9 = read(ks->f,ks->buf,0x4000);
                  iVar3 = (int)sVar9;
                  ks->end = iVar3;
                  dVar15 = local_d8;
                  uVar19 = uStack_d0;
                  if (iVar3 == -1) {
                    ks->is_eof = 1;
                    sVar13 = 0xfffffffd;
                  }
                  else {
                    if (iVar3 != 0) goto LAB_004b425c;
                    ks->is_eof = 1;
                    sVar13 = 0xffffffff;
                  }
                }
              }
              local_e0 = (uint)sVar13;
            } while (((-1 < (int)local_e0) && (local_e0 != 0x40)) && (local_e0 != 0x3e));
            if (-1 < (int)local_e0) {
              *(uint *)&str_00[4].l = local_e0;
              goto LAB_004b4290;
            }
          }
          else {
LAB_004b4290:
            str_00[3].l = 0;
            str_00[2].l = 0;
            str_00[1].l = 0;
            uVar4 = ks_getuntil2(ks,0,str_00,(int *)&local_e0,0);
            if ((int)uVar4 < 0) {
              sVar13 = (size_t)uVar4;
              dVar15 = local_d8;
              uVar19 = uStack_d0;
            }
            else {
              if (local_e0 != 10) {
                ks_getuntil2(ks,2,local_40,(int *)0x0,0);
              }
              dVar15 = local_d8;
              uVar19 = uStack_d0;
              if (str_00[2].s == (char *)0x0) {
                str_00[2].m = 0x100;
                pcVar10 = (char *)malloc(0x100);
                str_00[2].s = pcVar10;
                dVar15 = local_d8;
                uVar19 = uStack_d0;
              }
LAB_004b4305:
              iVar3 = ks->end;
              uVar4 = 0xfffffffd;
              if ((iVar3 != -1) && ((ks->is_eof == 0 || (uVar4 = 0xffffffff, ks->begin < iVar3)))) {
                if (ks->begin < iVar3) {
LAB_004b436a:
                  iVar3 = ks->begin;
                  ks->begin = iVar3 + 1;
                  uVar4 = (uint)ks->buf[iVar3];
                }
                else {
                  ks->begin = 0;
                  sVar9 = read(ks->f,ks->buf,0x4000);
                  iVar3 = (int)sVar9;
                  ks->end = iVar3;
                  dVar15 = local_d8;
                  uVar19 = uStack_d0;
                  if (iVar3 == -1) {
                    ks->is_eof = 1;
                    uVar4 = 0xfffffffd;
                  }
                  else {
                    if (iVar3 != 0) goto LAB_004b436a;
                    ks->is_eof = 1;
                    uVar4 = 0xffffffff;
                  }
                }
              }
              local_e0 = uVar4;
              if (-1 < (int)uVar4) {
                if ((int)uVar4 < 0x2b) goto code_r0x004b4389;
                if (uVar4 != 0x2b) {
                  if ((uVar4 != 0x3e) && (uVar4 != 0x40)) goto LAB_004b43a3;
                  *(uint *)&str_00[4].l = uVar4;
                }
              }
              sVar13 = str_00[2].l;
              uVar12 = sVar13 + 1;
              if (str_00[2].m <= uVar12) {
                uVar12 = uVar12 >> 1 | uVar12;
                uVar12 = uVar12 >> 2 | uVar12;
                uVar12 = uVar12 >> 4 | uVar12;
                uVar12 = uVar12 >> 8 | uVar12;
                __size = (uVar12 >> 0x10 | uVar12) + 1;
                str_00[2].m = __size;
                pcVar10 = (char *)realloc(str_00[2].s,__size);
                str_00[2].s = pcVar10;
                dVar15 = local_d8;
                uVar19 = uStack_d0;
              }
              str_00[2].s[sVar13] = '\0';
              if (local_e0 == 0x2b) {
                uVar12 = str_00[2].m;
                str = local_38;
                if (str_00[3].m < uVar12) {
                  str_00[3].m = uVar12;
                  pcVar10 = (char *)realloc(str_00[3].s,uVar12);
                  str_00[3].s = pcVar10;
                  dVar15 = local_d8;
                  uVar19 = uStack_d0;
                  str = local_38;
                }
                do {
                  iVar3 = ks->end;
                  uVar4 = 0xfffffffd;
                  if ((iVar3 != -1) &&
                     ((ks->is_eof == 0 || (uVar4 = 0xffffffff, ks->begin < iVar3)))) {
                    if (ks->begin < iVar3) {
LAB_004b44f5:
                      iVar3 = ks->begin;
                      ks->begin = iVar3 + 1;
                      uVar4 = (uint)ks->buf[iVar3];
                    }
                    else {
                      ks->begin = 0;
                      sVar9 = read(ks->f,ks->buf,0x4000);
                      iVar3 = (int)sVar9;
                      ks->end = iVar3;
                      dVar15 = local_d8;
                      uVar19 = uStack_d0;
                      if (iVar3 == -1) {
                        ks->is_eof = 1;
                        uVar4 = 0xfffffffd;
                      }
                      else {
                        if (iVar3 != 0) goto LAB_004b44f5;
                        ks->is_eof = 1;
                        uVar4 = 0xffffffff;
                      }
                    }
                  }
                  local_e0 = uVar4;
                } while ((-1 < (int)uVar4) && (uVar4 != 10));
                if (uVar4 == 0xffffffff) {
                  sVar13 = 0xfffffffe;
                  local_e0 = 0xffffffff;
                }
                else {
                  do {
                    iVar3 = ks_getuntil2(ks,2,str,(int *)0x0,1);
                    if (iVar3 < 0) {
                      local_e0 = 0;
                      break;
                    }
                    bVar14 = str->l < str_00[2].l;
                    local_e0 = (uint)bVar14;
                  } while (bVar14);
                  sVar13 = 0xfffffffd;
                  dVar15 = local_d8;
                  uVar19 = uStack_d0;
                  if (local_e0 != 0xfffffffd) {
                    *(undefined4 *)&str_00[4].l = 0;
                    sVar13 = str_00[2].l & 0xffffffff;
                    if (str_00[2].l != str_00[3].l) {
                      sVar13 = 0xfffffffe;
                    }
                  }
                }
              }
            }
          }
          if ((int)sVar13 < 0) {
            local_b8._0_4_ = SUB84(local_80,0);
            local_b8._4_4_ = (undefined4)((ulong)local_80 >> 0x20);
            uStack_b0._0_4_ = 0;
            uStack_b0._4_4_ = 0;
            dStack_a0 = 0.0;
            uVar12 = local_c0;
            local_d8 = dVar15;
            uStack_d0 = uVar19;
            local_a8 = local_88;
            goto LAB_004b47e2;
          }
          piVar6 = __errno_location();
          uVar2 = local_c0;
          *piVar6 = 0;
          sVar13 = str_00->l;
          __ptr[local_c0].name.l = sVar13;
          __ptr[local_c0].comment.l = str_00[1].l;
          sVar1 = str_00[2].l;
          __ptr[local_c0].seq.l = sVar1;
          __ptr[local_c0].qual.l = str_00[3].l;
          __ptr[local_c0].name.s = (char *)0x0;
          __ptr[local_c0].comment.s = (char *)0x0;
          __ptr[local_c0].seq.s = (char *)0x0;
          __ptr[local_c0].qual.s = (char *)0x0;
          auVar17._8_4_ = (int)(sVar1 >> 0x20);
          auVar17._0_8_ = sVar1;
          auVar17._12_4_ = 0x45300000;
          uStack_b0 = auVar17._8_8_ - 1.9342813113834067e+25;
          dVar15 = uStack_b0 + ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
          local_b8 = dVar15;
          local_a8 = dVar15;
          if (local_c0 != 0) {
            local_b8 = local_80;
            if (dVar15 <= local_80) {
              local_b8 = dVar15;
            }
            uStack_b0 = 0.0;
            local_a8 = local_88;
            if (local_88 <= dVar15) {
              uStack_b0 = 0.0;
              local_a8 = dVar15;
            }
          }
          uVar12 = local_c0 + 1;
          dVar16 = dVar15 - local_68;
          auVar20._8_4_ = (int)(uVar12 >> 0x20);
          auVar20._0_8_ = uVar12;
          auVar20._12_4_ = 0x45300000;
          local_68 = local_68 +
                     dVar16 / ((auVar20._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0));
          local_d8 = local_d8 + (dVar15 - local_68) * dVar16;
          local_70 = local_70 + sVar1;
          dStack_a0 = uStack_b0;
          if (sVar13 != 0) {
            pcVar10 = strdup_rpl(str_00->s);
            __ptr[uVar2].name.s = pcVar10;
            if (pcVar10 != (char *)0x0) goto LAB_004b46d4;
            pcVar10 = "strdup name";
LAB_004b4992:
            perror(pcVar10);
            local_dc = 1;
            uVar12 = local_c0;
            goto LAB_004b47f1;
          }
LAB_004b46d4:
          if (__ptr[uVar2].comment.l != 0) {
            pcVar10 = strdup_rpl(str_00[1].s);
            __ptr[uVar2].comment.s = pcVar10;
            if (pcVar10 == (char *)0x0) {
              pcVar10 = "strdup comment";
              goto LAB_004b4992;
            }
          }
          if (__ptr[uVar2].seq.l != 0) {
            pcVar10 = strdup_rpl(str_00[2].s);
            __ptr[uVar2].seq.s = pcVar10;
            if (pcVar10 == (char *)0x0) {
              pcVar10 = "strdup seq";
              goto LAB_004b4992;
            }
          }
          if (__ptr[uVar2].qual.l != 0) {
            pcVar10 = strdup_rpl(str_00[3].s);
            __ptr[uVar2].qual.s = pcVar10;
            if (pcVar10 == (char *)0x0) {
              pcVar10 = "strdup qual";
              goto LAB_004b4992;
            }
          }
          local_80 = local_b8;
          local_88 = local_a8;
          local_c0 = uVar12;
        } while (uVar12 < local_90);
        *piVar6 = 0;
        ppVar11 = (parasail_sequence_t *)realloc(__ptr,local_90 << 7);
        if (ppVar11 == (parasail_sequence_t *)0x0) {
          perror("realloc");
          local_dc = 2;
        }
        else {
          *piVar6 = 0;
          __ptr = ppVar11;
        }
        local_90 = local_90 * 2;
        uVar21 = (undefined4)local_b8;
        uVar22 = local_b8._4_4_;
        dVar15 = local_a8;
      } while (ppVar11 != (parasail_sequence_t *)0x0);
LAB_004b47e2:
      local_c0 = uVar12 - 1;
LAB_004b47f1:
      iVar3 = local_74;
      if (str_00 != (kstring_t *)0x0) {
        free(str_00->s);
        free(str_00[1].s);
        free(str_00[2].s);
        free(str_00[3].s);
        puVar7 = (undefined8 *)str_00[4].m;
        if (puVar7 != (undefined8 *)0x0) {
          free((void *)*puVar7);
          free(puVar7);
        }
        free(str_00);
      }
      if (iVar3 != 0) {
        fclose(local_50);
      }
      ppVar5 = local_48;
      local_48->seqs = __ptr;
      local_48->l = uVar12;
      local_48->characters = local_70;
      local_48->shortest =
           (long)(double)CONCAT44(local_b8._4_4_,(undefined4)local_b8) >> 0x3f &
           (long)((double)CONCAT44(local_b8._4_4_,(undefined4)local_b8) - 9.223372036854776e+18) |
           (long)(double)CONCAT44(local_b8._4_4_,(undefined4)local_b8);
      local_48->longest =
           (long)local_a8 >> 0x3f & (long)(local_a8 - 9.223372036854776e+18) | (long)local_a8;
      auVar18._0_8_ = (double)CONCAT44(0x43300000,(int)local_c0);
      auVar18._8_4_ = (int)(local_c0 >> 0x20);
      auVar18._12_4_ = 0x45300000;
      local_48->mean = (float)local_68;
      dVar15 = local_d8 /
               ((auVar18._8_8_ - 1.9342813113834067e+25) + (auVar18._0_8_ - 4503599627370496.0));
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      ppVar5->stddev = (float)dVar15;
      if (local_dc == 0) {
        return ppVar5;
      }
      parasail_sequences_from_file_cold_2();
    }
  }
  return (parasail_sequences_t *)0x0;
code_r0x004b4389:
  if (uVar4 != 10) {
LAB_004b43a3:
    sVar13 = str_00[2].l;
    str_00[2].l = sVar13 + 1;
    str_00[2].s[sVar13] = (char)uVar4;
    ks_getuntil2(ks,2,str_00 + 2,(int *)0x0,1);
    dVar15 = local_d8;
    uVar19 = uStack_d0;
  }
  goto LAB_004b4305;
}

Assistant:

parasail_sequences_t* parasail_sequences_from_file(const char *filename)
{
#if HAVE_ZLIB
    gzFile fp;
#else
    FILE* fp;
    int is_stdin = 0;
#endif
    kseq_t *seq = NULL;
    int l = 0;
    parasail_sequences_t *retval = NULL;
    parasail_sequence_t *sequences = NULL;
    unsigned long count = 0;
    unsigned long capacity = 1000;
    size_t chars = 0;
    stats_t stats;
    int error_during_kseq = 0;

    stats_clear(&stats);

    retval = (parasail_sequences_t*)malloc(sizeof(parasail_sequences_t));
    if (NULL == retval) {
        perror("malloc");
        fprintf(stderr, "parasail_sequences_from_file: failed\n");
        return NULL;
    }
    sequences = (parasail_sequence_t*)malloc(sizeof(parasail_sequence_t) * capacity);
    if (NULL == sequences) {
        perror("malloc");
        fprintf(stderr, "parasail_sequences_from_file: failed\n");
        free(retval);
        return NULL;
    }

    /* check for stdin instead of a normal filename */
    if (0 == strncmp("stdin", filename, 5)) {
#if HAVE_ZLIB
        fp = gzdopen(fileno(stdin), "r");
        if (fp == Z_NULL) {
            perror("gzdopen");
            fprintf(stderr, "parasail_sequences_from_file: failed\n");
            free(sequences);
            free(retval);
            return NULL;
        }
#else
        fp = stdin;
        is_stdin = 1;
#endif
    }
    else {
        /* open the file */
        errno = 0;
#if HAVE_ZLIB
        fp = gzopen(filename, "r");
        if (fp == Z_NULL) {
            perror("gzopen");
            fprintf(stderr, "parasail_sequences_from_file: failed\n");
            free(sequences);
            free(retval);
            return NULL;
        }
#else
        fp = fopen(filename, "r");
        if (fp == NULL) {
            perror("fopen");
            fprintf(stderr, "parasail_sequences_from_file: failed\n");
            free(sequences);
            free(retval);
            return NULL;
        }
#endif
    }
    
    /* initialize kseq structures */
#if HAVE_ZLIB
    seq = kseq_init(fp);
#else
    seq = kseq_init(fileno(fp));
#endif

    /* parse file */
    while ((l = kseq_read(seq)) >= 0) {
        errno = 0;
        sequences[count].name.l = seq->name.l;
        sequences[count].comment.l = seq->comment.l;
        sequences[count].seq.l = seq->seq.l;
        sequences[count].qual.l = seq->qual.l;
        sequences[count].name.s = NULL;
        sequences[count].comment.s = NULL;
        sequences[count].seq.s = NULL;
        sequences[count].qual.s = NULL;

        stats_sample_value(&stats, seq->seq.l);
        chars += seq->seq.l;

        if (sequences[count].name.l) {
            sequences[count].name.s = strdup_rpl(seq->name.s);
            if (NULL == sequences[count].name.s) {
                perror("strdup name");
                error_during_kseq = 1;
                break;
            }
        }
        if (sequences[count].comment.l) {
            sequences[count].comment.s = strdup_rpl(seq->comment.s);
            if (NULL == sequences[count].comment.s) {
                perror("strdup comment");
                error_during_kseq = 1;
                break;
            }
        }
        if (sequences[count].seq.l) {
            sequences[count].seq.s = strdup_rpl(seq->seq.s);
            if (NULL == sequences[count].seq.s) {
                perror("strdup seq");
                error_during_kseq = 1;
                break;
            }
        }
        if (sequences[count].qual.l) {
            sequences[count].qual.s = strdup_rpl(seq->qual.s);
            if (NULL == sequences[count].qual.s) {
                perror("strdup qual");
                error_during_kseq = 1;
                break;
            }
        }
        ++count;

        /* allocate more space for sequences if we ran out */
        if (count >= capacity) {
            parasail_sequence_t *new_sequences = NULL;
            capacity *= 2;
            errno = 0;
            new_sequences = (parasail_sequence_t*)realloc(sequences, sizeof(parasail_sequence_t) * capacity);
            if (NULL == new_sequences) {
                perror("realloc");
                error_during_kseq = 2;
                break;
            }
            sequences = new_sequences;
            errno = 0;
        }
    }
    kseq_destroy(seq);
#if HAVE_ZLIB
    gzclose(fp);
#else
    if (!is_stdin) {
        fclose(fp);
    }
#endif

    retval->seqs = sequences;
    retval->l = count;
    retval->characters = chars;
    retval->shortest = stats._min;
    retval->longest = stats._max;
    retval->mean = stats._mean;
    retval->stddev = stats_stddev(&stats);

    if (0 != error_during_kseq) {
        fprintf(stderr, "parasail_sequences_from_file: failed\n");
        if (1 == error_during_kseq) {
            retval->l++;
        }
        parasail_sequences_free(retval);
        return NULL;
    }

    return retval;
}